

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut2.c
# Opt level: O2

int Sbd_ManCutServerFirst(Sbd_Srv_t *p,int iObj,int *pLeaves)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  int Entry;
  Vec_Int_t *pVVar3;
  int i;
  int LevStop;
  int in_stack_ffffffffffffffb8;
  
  iVar1 = Vec_IntEntry(p->vLutLevs,iObj);
  LevStop = iVar1 + -2;
  p->vCut->nSize = 0;
  Gia_ManIncrementTravId(p->pGia);
  pVVar3 = p->vMirrors;
  iVar2 = Sbd_ManCutCollect_rec(p->pGia,pVVar3,iObj,LevStop,p->vLutLevs,p->vCut);
  if (iVar2 == 0) {
    return -1;
  }
  Vec_IntSort(p->vCut,(int)pVVar3);
  Sbd_ManCutExpand(p->pGia,p->vMirrors,p->vLutLevs,p->vCut);
  Sbd_ManCutReload(p->vMirrors,p->vLutLevs,LevStop,p->vCut,p->vCutTop,p->vCutBot);
  pVVar3 = p->vCut;
  iVar2 = pVVar3->nSize;
  if ((p->nCutSize < iVar2) || (p->nLutSize <= p->vCutTop->nSize)) {
    p_00 = p->vCut0;
    p_00->nSize = 0;
    for (iVar2 = 0; iVar2 < pVVar3->nSize; iVar2 = iVar2 + 1) {
      Entry = Vec_IntEntry(pVVar3,iVar2);
      Vec_IntPush(p_00,Entry);
    }
    pVVar3 = p->vCut;
    if (pVVar3->nSize < p->nCutSize) {
      iVar2 = Sbd_ManCutReduceTop(p->pGia,p->vMirrors,iObj,p->vLutLevs,pVVar3,p->vCutTop,
                                  in_stack_ffffffffffffffb8);
      pVVar3 = p->vCut;
      if (iVar2 != 0) {
        Sbd_ManCutExpand(p->pGia,p->vMirrors,p->vLutLevs,pVVar3);
        Sbd_ManCutReload(p->vMirrors,p->vLutLevs,LevStop,p->vCut,p->vCutTop,p->vCutBot);
        pVVar3 = p->vCut;
        iVar2 = pVVar3->nSize;
        if (p->nCutSize < iVar2) {
          __assert_fail("Vec_IntSize(p->vCut) <= p->nCutSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                        ,0x15a,"int Sbd_ManCutServerFirst(Sbd_Srv_t *, int, int *)");
        }
        if (p->vCutTop->nSize < p->nLutSize) goto LAB_0045c2d9;
        if (iVar2 < p->nCutSize) {
          iVar2 = Sbd_ManCutReduceTop(p->pGia,p->vMirrors,iObj,p->vLutLevs,pVVar3,p->vCutTop,
                                      in_stack_ffffffffffffffb8);
          pVVar3 = p->vCut;
          if (iVar2 != 0) {
            Sbd_ManCutExpand(p->pGia,p->vMirrors,p->vLutLevs,pVVar3);
            Sbd_ManCutReload(p->vMirrors,p->vLutLevs,LevStop,p->vCut,p->vCutTop,p->vCutBot);
            pVVar3 = p->vCut;
            iVar2 = pVVar3->nSize;
            if (p->nCutSize < iVar2) {
              __assert_fail("Vec_IntSize(p->vCut) <= p->nCutSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                            ,0x166,"int Sbd_ManCutServerFirst(Sbd_Srv_t *, int, int *)");
            }
            if (p->vCutTop->nSize < p->nLutSize) goto LAB_0045c2d9;
            if (iVar2 < p->nCutSize) {
              iVar2 = Sbd_ManCutReduceTop(p->pGia,p->vMirrors,iObj,p->vLutLevs,pVVar3,p->vCutTop,
                                          in_stack_ffffffffffffffb8);
              pVVar3 = p->vCut;
              if (iVar2 != 0) {
                Sbd_ManCutExpand(p->pGia,p->vMirrors,p->vLutLevs,pVVar3);
                Sbd_ManCutReload(p->vMirrors,p->vLutLevs,LevStop,p->vCut,p->vCutTop,p->vCutBot);
                pVVar3 = p->vCut;
                iVar2 = pVVar3->nSize;
                if (p->nCutSize < iVar2) {
                  __assert_fail("Vec_IntSize(p->vCut) <= p->nCutSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                                ,0x172,"int Sbd_ManCutServerFirst(Sbd_Srv_t *, int, int *)");
                }
                if (p->vCutTop->nSize < p->nLutSize) goto LAB_0045c2d9;
                if (iVar2 < p->nCutSize) {
                  iVar2 = Sbd_ManCutReduceTop(p->pGia,p->vMirrors,iObj,p->vLutLevs,pVVar3,p->vCutTop
                                              ,in_stack_ffffffffffffffb8);
                  pVVar3 = p->vCut;
                  if (iVar2 != 0) {
                    Sbd_ManCutExpand(p->pGia,p->vMirrors,p->vLutLevs,pVVar3);
                    Sbd_ManCutReload(p->vMirrors,p->vLutLevs,LevStop,p->vCut,p->vCutTop,p->vCutBot);
                    pVVar3 = p->vCut;
                    iVar2 = pVVar3->nSize;
                    if (p->nCutSize < iVar2) {
                      __assert_fail("Vec_IntSize(p->vCut) <= p->nCutSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                                    ,0x17e,"int Sbd_ManCutServerFirst(Sbd_Srv_t *, int, int *)");
                    }
                    if (p->vCutTop->nSize < p->nLutSize) goto LAB_0045c2d9;
                  }
                }
              }
            }
          }
        }
      }
    }
    pVVar3->nSize = 0;
    Gia_ManIncrementTravId(p->pGia);
    pVVar3 = p->vMirrors;
    iVar1 = Sbd_ManCutCollect_rec(p->pGia,pVVar3,iObj,iVar1 + -3,p->vLutLevs,p->vCut);
    if (iVar1 == 0) {
      return -1;
    }
    Vec_IntSort(p->vCut,(int)pVVar3);
    Sbd_ManCutExpand(p->pGia,p->vMirrors,p->vLutLevs,p->vCut);
    Sbd_ManCutReload(p->vMirrors,p->vLutLevs,LevStop,p->vCut,p->vCutTop,p->vCutBot);
    pVVar3 = p->vCut;
    iVar2 = pVVar3->nSize;
    if (p->nCutSize < iVar2) {
      return -1;
    }
    if (p->nLutSize <= p->vCutTop->nSize) {
      return -1;
    }
  }
LAB_0045c2d9:
  memcpy(pLeaves,pVVar3->pArray,(long)iVar2 << 2);
  return p->vCut->nSize;
}

Assistant:

int Sbd_ManCutServerFirst( Sbd_Srv_t * p, int iObj, int * pLeaves )
{
    int RetValue, LevStop = Vec_IntEntry(p->vLutLevs, iObj) - 2;

    Vec_IntClear( p->vCut );
    Gia_ManIncrementTravId( p->pGia );
    RetValue = Sbd_ManCutCollect_rec( p->pGia, p->vMirrors, iObj, LevStop, p->vLutLevs, p->vCut );
    if ( RetValue == 0 ) // cannot build delay-improving cut
        return -1;
    // check if the current cut is good
    Vec_IntSort( p->vCut, 0 );
/*
    Sbd_ManCutReload( p->vMirrors, p->vLutLevs, LevStop, p->vCut, p->vCutTop, p->vCutBot );
    if ( Vec_IntSize(p->vCut) <= p->nCutSize && Vec_IntSize(p->vCutTop) <= p->nLutSize-1 )
    {
        //printf( "%d ", Vec_IntSize(p->vCut) );
        memcpy( pLeaves, Vec_IntArray(p->vCut), sizeof(int) * Vec_IntSize(p->vCut) );
        return Vec_IntSize(p->vCut);
    }
*/
    // try to expand the cut
    Sbd_ManCutExpand( p->pGia, p->vMirrors, p->vLutLevs, p->vCut );
    Sbd_ManCutReload( p->vMirrors, p->vLutLevs, LevStop, p->vCut, p->vCutTop, p->vCutBot );
    if ( Vec_IntSize(p->vCut) <= p->nCutSize && Vec_IntSize(p->vCutTop) <= p->nLutSize-1 )
    {
        //printf( "1=(%d,%d) ", Vec_IntSize(p->vCutTop), Vec_IntSize(p->vCutBot) );
        //printf( "%d ", Vec_IntSize(p->vCut) );
        memcpy( pLeaves, Vec_IntArray(p->vCut), sizeof(int) * Vec_IntSize(p->vCut) );
        return Vec_IntSize(p->vCut);
    }

    // try to reduce the topmost
    Vec_IntClear( p->vCut0 );
    Vec_IntAppend( p->vCut0, p->vCut );
    if ( Vec_IntSize(p->vCut) < p->nCutSize && Sbd_ManCutReduceTop( p->pGia, p->vMirrors, iObj, p->vLutLevs, p->vCut, p->vCutTop, p->nCutSize ) )
    {
        Sbd_ManCutExpand( p->pGia, p->vMirrors, p->vLutLevs, p->vCut );
        Sbd_ManCutReload( p->vMirrors, p->vLutLevs, LevStop, p->vCut, p->vCutTop, p->vCutBot );
        assert( Vec_IntSize(p->vCut) <= p->nCutSize );
        if ( Vec_IntSize(p->vCutTop) <= p->nLutSize-1 )
        {
            //printf( "%d -> %d (%d + %d)\n", Vec_IntSize(p->vCut0), Vec_IntSize(p->vCut), Vec_IntSize(p->vCutTop), Vec_IntSize(p->vCutBot) );
            memcpy( pLeaves, Vec_IntArray(p->vCut), sizeof(int) * Vec_IntSize(p->vCut) );
            return Vec_IntSize(p->vCut);
        }
        // try again
        if ( Vec_IntSize(p->vCut) < p->nCutSize && Sbd_ManCutReduceTop( p->pGia, p->vMirrors, iObj, p->vLutLevs, p->vCut, p->vCutTop, p->nCutSize ) )
        {
            Sbd_ManCutExpand( p->pGia, p->vMirrors, p->vLutLevs, p->vCut );
            Sbd_ManCutReload( p->vMirrors, p->vLutLevs, LevStop, p->vCut, p->vCutTop, p->vCutBot );
            assert( Vec_IntSize(p->vCut) <= p->nCutSize );
            if ( Vec_IntSize(p->vCutTop) <= p->nLutSize-1 )
            {
                //printf( "* %d -> %d (%d + %d)\n", Vec_IntSize(p->vCut0), Vec_IntSize(p->vCut), Vec_IntSize(p->vCutTop), Vec_IntSize(p->vCutBot) );
                memcpy( pLeaves, Vec_IntArray(p->vCut), sizeof(int) * Vec_IntSize(p->vCut) );
                return Vec_IntSize(p->vCut);
            }
            // try again
            if ( Vec_IntSize(p->vCut) < p->nCutSize && Sbd_ManCutReduceTop( p->pGia, p->vMirrors, iObj, p->vLutLevs, p->vCut, p->vCutTop, p->nCutSize ) )
            {
                Sbd_ManCutExpand( p->pGia, p->vMirrors, p->vLutLevs, p->vCut );
                Sbd_ManCutReload( p->vMirrors, p->vLutLevs, LevStop, p->vCut, p->vCutTop, p->vCutBot );
                assert( Vec_IntSize(p->vCut) <= p->nCutSize );
                if ( Vec_IntSize(p->vCutTop) <= p->nLutSize-1 )
                {
                    //printf( "** %d -> %d (%d + %d)\n", Vec_IntSize(p->vCut0), Vec_IntSize(p->vCut), Vec_IntSize(p->vCutTop), Vec_IntSize(p->vCutBot) );
                    memcpy( pLeaves, Vec_IntArray(p->vCut), sizeof(int) * Vec_IntSize(p->vCut) );
                    return Vec_IntSize(p->vCut);
                }
                // try again
                if ( Vec_IntSize(p->vCut) < p->nCutSize && Sbd_ManCutReduceTop( p->pGia, p->vMirrors, iObj, p->vLutLevs, p->vCut, p->vCutTop, p->nCutSize ) )
                {
                    Sbd_ManCutExpand( p->pGia, p->vMirrors, p->vLutLevs, p->vCut );
                    Sbd_ManCutReload( p->vMirrors, p->vLutLevs, LevStop, p->vCut, p->vCutTop, p->vCutBot );
                    assert( Vec_IntSize(p->vCut) <= p->nCutSize );
                    if ( Vec_IntSize(p->vCutTop) <= p->nLutSize-1 )
                    {
                        //printf( "*** %d -> %d (%d + %d)\n", Vec_IntSize(p->vCut0), Vec_IntSize(p->vCut), Vec_IntSize(p->vCutTop), Vec_IntSize(p->vCutBot) );
                        memcpy( pLeaves, Vec_IntArray(p->vCut), sizeof(int) * Vec_IntSize(p->vCut) );
                        return Vec_IntSize(p->vCut);
                    }
                }
            }
        }
    }

    // recompute the cut
    Vec_IntClear( p->vCut );
    Gia_ManIncrementTravId( p->pGia );
    RetValue = Sbd_ManCutCollect_rec( p->pGia, p->vMirrors, iObj, LevStop-1, p->vLutLevs, p->vCut );
    if ( RetValue == 0 ) // cannot build delay-improving cut
        return -1;
    // check if the current cut is good
    Vec_IntSort( p->vCut, 0 );
/*
    Sbd_ManCutReload( p->vMirrors, p->vLutLevs, LevStop, p->vCut, p->vCutTop, p->vCutBot );
    if ( Vec_IntSize(p->vCut) <= p->nCutSize && Vec_IntSize(p->vCutTop) <= p->nLutSize-1 )
    {
        //printf( "%d ", Vec_IntSize(p->vCut) );
        memcpy( pLeaves, Vec_IntArray(p->vCut), sizeof(int) * Vec_IntSize(p->vCut) );
        return Vec_IntSize(p->vCut);
    }
*/
    // try to expand the cut
    Sbd_ManCutExpand( p->pGia, p->vMirrors, p->vLutLevs, p->vCut );
    Sbd_ManCutReload( p->vMirrors, p->vLutLevs, LevStop, p->vCut, p->vCutTop, p->vCutBot );
    if ( Vec_IntSize(p->vCut) <= p->nCutSize && Vec_IntSize(p->vCutTop) <= p->nLutSize-1 )
    {
        //printf( "2=(%d,%d) ", Vec_IntSize(p->vCutTop), Vec_IntSize(p->vCutBot) );
        //printf( "%d ", Vec_IntSize(p->vCut) );
        memcpy( pLeaves, Vec_IntArray(p->vCut), sizeof(int) * Vec_IntSize(p->vCut) );
        return Vec_IntSize(p->vCut);
    }

    return -1;
}